

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  byte bVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_51;
  LogMessage local_50 [56];
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x2ff);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)&internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      if (this->insertion_point_ == (string *)&internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->insertion_point_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->insertion_point_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      if (this->content_ == (string *)&internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->content_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->content_);
    }
  }
  google::protobuf::UnknownFieldSet::MergeFrom(&this->_unknown_fields_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_insertion_point()) {
      set_insertion_point(from.insertion_point());
    }
    if (from.has_content()) {
      set_content(from.content());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}